

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O1

decNumber * uprv_decNumberFromString_63(decNumber *dn,char *chars,decContext *set)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  decNumber *pdVar4;
  uint uVar5;
  byte *pbVar6;
  uint8_t *lsu;
  uint8_t *puVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  uint len;
  char *pcVar11;
  char *pcVar12;
  ulong uVar13;
  uint8_t *buffer;
  char cVar14;
  byte *pbVar15;
  byte bVar16;
  byte *pbVar17;
  byte *pbVar18;
  int iVar19;
  uint32_t status;
  int32_t residue;
  uint8_t resbuff [45];
  uint32_t local_84;
  decNumber *local_80;
  int32_t local_74;
  decContext *local_70;
  uint8_t local_68 [56];
  
  lVar8 = 0;
  len = 0;
  pbVar6 = (byte *)0x0;
  pbVar15 = (byte *)0x0;
  bVar16 = 0;
  pbVar17 = (byte *)chars;
  do {
    pbVar18 = (byte *)(chars + lVar8);
    bVar1 = chars[lVar8];
    if ((byte)(bVar1 - 0x30) < 10) {
      len = len + 1;
      pbVar15 = pbVar18;
    }
    else if (pbVar6 == (byte *)0x0 && bVar1 == 0x2e) {
      pbVar17 = pbVar17 + (pbVar18 == pbVar17);
      pbVar6 = pbVar18;
    }
    else {
      if (lVar8 != 0) goto LAB_0024529b;
      if (bVar1 == 0x2b) {
        pbVar17 = pbVar17 + 1;
      }
      else {
        if (bVar1 != 0x2d) goto LAB_0024529b;
        pbVar17 = pbVar17 + 1;
        bVar16 = 0x80;
      }
    }
    lVar8 = lVar8 + 1;
  } while( true );
LAB_002453ba:
  cVar2 = chars[lVar8 + lVar9];
  if ((cVar2 != "inf"[lVar9]) && (cVar2 != "INF"[lVar9])) {
    dn->bits = bVar16 | 0x20;
    if ((*pbVar17 | 0x20) == 0x73) {
      pbVar17 = (byte *)(chars + lVar8 + 1);
      dn->bits = bVar16 | 0x10;
    }
    if ((((*pbVar17 | 0x20) == 0x6e) && ((pbVar17[1] | 0x20) == 0x61)) &&
       ((pbVar17[2] | 0x20) == 0x6e)) {
      for (pbVar17 = pbVar17 + 3; *pbVar17 == 0x30; pbVar17 = pbVar17 + 1) {
      }
      if (*pbVar17 == 0) goto LAB_002453e0;
      bVar16 = *pbVar17;
      if ((byte)(bVar16 - 0x3a) < 0xf6) {
        pbVar15 = (byte *)0x0;
      }
      else {
        pbVar15 = pbVar17 + -1;
        do {
          len = len + 1;
          bVar16 = pbVar15[2];
          pbVar15 = pbVar15 + 1;
        } while (0xf5 < (byte)(bVar16 - 0x3a));
      }
      if (bVar16 == 0) {
        if ((set->digits <= (int)len) &&
           ((buffer = (uint8_t *)0x0, set->clamp != '\0' || (set->digits < (int)len))))
        goto LAB_0024565a;
        bVar16 = dn->bits;
        goto LAB_002454ed;
      }
    }
    goto LAB_00245427;
  }
  if (cVar2 != '\0') goto code_r0x002453d3;
  goto LAB_002453d8;
code_r0x002453d3:
  lVar9 = lVar9 + 1;
  goto LAB_002453ba;
LAB_0024529b:
  local_80 = dn;
  if (pbVar15 == (byte *)0x0) {
    local_84 = 1;
    if (pbVar6 == (byte *)0x0 && bVar1 != 0) {
      pbVar17 = (byte *)(chars + lVar8);
      dn->bits = '\0';
      dn->lsu[0] = '\0';
      dn->digits = 1;
      dn->exponent = 0;
      lVar9 = 0;
      while( true ) {
        cVar2 = chars[lVar8 + lVar9];
        if ((cVar2 != "infinity"[lVar9]) && (cVar2 != "INFINITY"[lVar9])) {
          lVar9 = 0;
          goto LAB_002453ba;
        }
        if (cVar2 == '\0') break;
        lVar9 = lVar9 + 1;
      }
LAB_002453d8:
      dn->bits = bVar16 | 0x40;
LAB_002453e0:
      local_84 = 0;
    }
LAB_00245427:
    buffer = (uint8_t *)0x0;
  }
  else {
    if (bVar1 == 0) {
LAB_002454ed:
      local_84 = 0;
      iVar10 = 0;
    }
    else {
      local_84 = 1;
      if ((bVar1 | 0x20) == 0x65) {
        cVar2 = chars[lVar8 + 1];
        pcVar11 = chars + lVar8 + 2;
        if ((cVar2 - 0x2bU & 0xfd) != 0) {
          pcVar11 = chars + lVar8 + 1;
        }
        if (*pcVar11 == '\0') goto LAB_00245374;
        do {
          pcVar12 = pcVar11;
          pcVar11 = pcVar12 + 1;
          if (*pcVar12 != '0') break;
        } while (*pcVar11 != '\0');
        cVar14 = *pcVar12;
        if ((byte)(cVar14 - 0x3aU) < 0xf6) {
          uVar13 = 0;
          iVar10 = 0;
        }
        else {
          iVar10 = 0;
          uVar13 = 0;
          do {
            iVar10 = (int)cVar14 + iVar10 * 10 + -0x30;
            cVar14 = pcVar11[uVar13];
            uVar13 = uVar13 + 1;
          } while (0xf5 < (byte)(cVar14 - 0x3aU));
        }
        if (cVar14 == '\0') {
          iVar19 = iVar10;
          if (uVar13 != 10) {
            iVar19 = 0x773593fe;
          }
          if ('1' < *pcVar12) {
            iVar19 = 0x773593fe;
          }
          if (uVar13 < 10) {
            iVar19 = iVar10;
          }
          iVar10 = -iVar19;
          if (cVar2 != '-') {
            iVar10 = iVar19;
          }
          local_84 = 0;
          bVar3 = true;
        }
        else {
          bVar3 = false;
        }
      }
      else {
LAB_00245374:
        bVar3 = false;
        iVar10 = 0;
      }
      if (!bVar3) goto LAB_00245427;
    }
    pbVar18 = pbVar17;
    if ((*pbVar17 == 0x30) && (pbVar17 < pbVar15)) {
      lVar8 = (long)pbVar15 - (long)pbVar17;
      do {
        if (*pbVar17 != 0x2e) {
          pbVar18 = pbVar17;
          if (*pbVar17 != 0x30) break;
          len = len - 1;
        }
        pbVar17 = pbVar17 + 1;
        lVar8 = lVar8 + -1;
        pbVar18 = pbVar15;
      } while (lVar8 != 0);
    }
    iVar19 = (int)pbVar6 - (int)pbVar15;
    if (pbVar15 <= pbVar6) {
      iVar19 = 0;
    }
    if (pbVar6 == (byte *)0x0) {
      iVar19 = 0;
    }
    if (set->digits < (int)len) {
      uVar5 = len;
      if ((int)len < 0x32) {
        uVar5 = (uint)""[(int)len];
      }
      bVar3 = true;
      lsu = local_68;
      if (uVar5 < 0x2e) {
        buffer = (uint8_t *)0x0;
      }
      else {
        local_70 = set;
        lsu = (uint8_t *)uprv_malloc_63((ulong)uVar5);
        bVar3 = true;
        buffer = lsu;
        set = local_70;
        if (lsu == (uint8_t *)0x0) {
          local_84 = local_84 | 0x10;
          buffer = (uint8_t *)0x0;
          lsu = local_68;
          bVar3 = false;
        }
      }
      if (!bVar3) goto LAB_0024565a;
    }
    else {
      lsu = dn->lsu;
      buffer = (uint8_t *)0x0;
    }
    pdVar4 = local_80;
    iVar19 = iVar19 + iVar10;
    puVar7 = lsu;
    for (; pbVar18 <= pbVar15; pbVar15 = pbVar15 + -1) {
      if (*pbVar15 != 0x2e) {
        *puVar7 = *pbVar15 - 0x30;
        puVar7 = puVar7 + 1;
      }
    }
    local_80->bits = bVar16;
    local_80->exponent = iVar19;
    local_80->digits = len;
    if (set->digits < (int)len) {
      local_74 = 0;
      decSetCoeff(local_80,set,lsu,len,&local_74,&local_84);
      decFinalize(pdVar4,set,&local_74,&local_84);
    }
    else if ((iVar19 <= (int)(set->emin - len)) || (set->emax - set->digits < iVar19 + -1)) {
      local_74 = 0;
      decFinalize(local_80,set,&local_74,&local_84);
    }
  }
LAB_0024565a:
  if (buffer != (uint8_t *)0x0) {
    uprv_free_63(buffer);
  }
  pdVar4 = local_80;
  if (local_84 != 0) {
    decStatus(local_80,local_84,set);
  }
  return pdVar4;
}

Assistant:

U_CAPI decNumber * U_EXPORT2 uprv_decNumberFromString(decNumber *dn, const char chars[],
                                decContext *set) {
  Int   exponent=0;                /* working exponent [assume 0]  */
  uByte bits=0;                    /* working flags [assume +ve]  */
  Unit  *res;                      /* where result will be built  */
  Unit  resbuff[SD2U(DECBUFFER+9)];/* local buffer in case need temporary  */
                                   /* [+9 allows for ln() constants]  */
  Unit  *allocres=NULL;            /* -> allocated result, iff allocated  */
  Int   d=0;                       /* count of digits found in decimal part  */
  const char *dotchar=NULL;        /* where dot was found  */
  const char *cfirst=chars;        /* -> first character of decimal part  */
  const char *last=NULL;           /* -> last digit of decimal part  */
  const char *c;                   /* work  */
  Unit  *up;                       /* ..  */
  #if DECDPUN>1
  Int   cut, out;                  /* ..  */
  #endif
  Int   residue;                   /* rounding residue  */
  uInt  status=0;                  /* error code  */

  #if DECCHECK
  if (decCheckOperands(DECUNRESU, DECUNUSED, DECUNUSED, set))
    return uprv_decNumberZero(dn);
  #endif

  do {                             /* status & malloc protection  */
    for (c=chars;; c++) {          /* -> input character  */
      if (*c>='0' && *c<='9') {    /* test for Arabic digit  */
        last=c;
        d++;                       /* count of real digits  */
        continue;                  /* still in decimal part  */
        }
      if (*c=='.' && dotchar==NULL) { /* first '.'  */
        dotchar=c;                 /* record offset into decimal part  */
        if (c==cfirst) cfirst++;   /* first digit must follow  */
        continue;}
      if (c==chars) {              /* first in string...  */
        if (*c=='-') {             /* valid - sign  */
          cfirst++;
          bits=DECNEG;
          continue;}
        if (*c=='+') {             /* valid + sign  */
          cfirst++;
          continue;}
        }
      /* *c is not a digit, or a valid +, -, or '.'  */
      break;
      } /* c  */

    if (last==NULL) {              /* no digits yet  */
      status=DEC_Conversion_syntax;/* assume the worst  */
      if (*c=='\0') break;         /* and no more to come...  */
      #if DECSUBSET
      /* if subset then infinities and NaNs are not allowed  */
      if (!set->extended) break;   /* hopeless  */
      #endif
      /* Infinities and NaNs are possible, here  */
      if (dotchar!=NULL) break;    /* .. unless had a dot  */
      uprv_decNumberZero(dn);           /* be optimistic  */
      if (decBiStr(c, "infinity", "INFINITY")
       || decBiStr(c, "inf", "INF")) {
        dn->bits=bits | DECINF;
        status=0;                  /* is OK  */
        break; /* all done  */
        }
      /* a NaN expected  */
      /* 2003.09.10 NaNs are now permitted to have a sign  */
      dn->bits=bits | DECNAN;      /* assume simple NaN  */
      if (*c=='s' || *c=='S') {    /* looks like an sNaN  */
        c++;
        dn->bits=bits | DECSNAN;
        }
      if (*c!='n' && *c!='N') break;    /* check caseless "NaN"  */
      c++;
      if (*c!='a' && *c!='A') break;    /* ..  */
      c++;
      if (*c!='n' && *c!='N') break;    /* ..  */
      c++;
      /* now either nothing, or nnnn payload, expected  */
      /* -> start of integer and skip leading 0s [including plain 0]  */
      for (cfirst=c; *cfirst=='0';) cfirst++;
      if (*cfirst=='\0') {         /* "NaN" or "sNaN", maybe with all 0s  */
        status=0;                  /* it's good  */
        break;                     /* ..  */
        }
      /* something other than 0s; setup last and d as usual [no dots]  */
      for (c=cfirst;; c++, d++) {
        if (*c<'0' || *c>'9') break; /* test for Arabic digit  */
        last=c;
        }
      if (*c!='\0') break;         /* not all digits  */
      if (d>set->digits-1) {
        /* [NB: payload in a decNumber can be full length unless  */
        /* clamped, in which case can only be digits-1]  */
        if (set->clamp) break;
        if (d>set->digits) break;
        } /* too many digits?  */
      /* good; drop through to convert the integer to coefficient  */
      status=0;                    /* syntax is OK  */
      bits=dn->bits;               /* for copy-back  */
      } /* last==NULL  */

     else if (*c!='\0') {          /* more to process...  */
      /* had some digits; exponent is only valid sequence now  */
      Flag nege;                   /* 1=negative exponent  */
      const char *firstexp;        /* -> first significant exponent digit  */
      status=DEC_Conversion_syntax;/* assume the worst  */
      if (*c!='e' && *c!='E') break;
      /* Found 'e' or 'E' -- now process explicit exponent */
      /* 1998.07.11: sign no longer required  */
      nege=0;
      c++;                         /* to (possible) sign  */
      if (*c=='-') {nege=1; c++;}
       else if (*c=='+') c++;
      if (*c=='\0') break;

      for (; *c=='0' && *(c+1)!='\0';) c++;  /* strip insignificant zeros  */
      firstexp=c;                            /* save exponent digit place  */
      uInt uexponent = 0;   /* Avoid undefined behavior on signed int overflow */
      for (; ;c++) {
        if (*c<'0' || *c>'9') break;         /* not a digit  */
        uexponent=X10(uexponent)+(uInt)*c-(uInt)'0';
        } /* c  */
      exponent = (Int)uexponent;
      /* if not now on a '\0', *c must not be a digit  */
      if (*c!='\0') break;

      /* (this next test must be after the syntax checks)  */
      /* if it was too long the exponent may have wrapped, so check  */
      /* carefully and set it to a certain overflow if wrap possible  */
      if (c>=firstexp+9+1) {
        if (c>firstexp+9+1 || *firstexp>'1') exponent=DECNUMMAXE*2;
        /* [up to 1999999999 is OK, for example 1E-1000000998]  */
        }
      if (nege) exponent=-exponent;     /* was negative  */
      status=0;                         /* is OK  */
      } /* stuff after digits  */

    /* Here when whole string has been inspected; syntax is good  */
    /* cfirst->first digit (never dot), last->last digit (ditto)  */

    /* strip leading zeros/dot [leave final 0 if all 0's]  */
    if (*cfirst=='0') {                 /* [cfirst has stepped over .]  */
      for (c=cfirst; c<last; c++, cfirst++) {
        if (*c=='.') continue;          /* ignore dots  */
        if (*c!='0') break;             /* non-zero found  */
        d--;                            /* 0 stripped  */
        } /* c  */
      #if DECSUBSET
      /* make a rapid exit for easy zeros if !extended  */
      if (*cfirst=='0' && !set->extended) {
        uprv_decNumberZero(dn);              /* clean result  */
        break;                          /* [could be return]  */
        }
      #endif
      } /* at least one leading 0  */

    /* Handle decimal point...  */
    if (dotchar!=NULL && dotchar<last)  /* non-trailing '.' found?  */
      exponent -= static_cast<int32_t>(last-dotchar);         /* adjust exponent  */
    /* [we can now ignore the .]  */

    /* OK, the digits string is good.  Assemble in the decNumber, or in  */
    /* a temporary units array if rounding is needed  */
    if (d<=set->digits) res=dn->lsu;    /* fits into supplied decNumber  */
     else {                             /* rounding needed  */
      Int needbytes=D2U(d)*sizeof(Unit);/* bytes needed  */
      res=resbuff;                      /* assume use local buffer  */
      if (needbytes>(Int)sizeof(resbuff)) { /* too big for local  */
        allocres=(Unit *)malloc(needbytes);
        if (allocres==NULL) {status|=DEC_Insufficient_storage; break;}
        res=allocres;
        }
      }
    /* res now -> number lsu, buffer, or allocated storage for Unit array  */

    /* Place the coefficient into the selected Unit array  */
    /* [this is often 70% of the cost of this function when DECDPUN>1]  */
    #if DECDPUN>1
    out=0;                         /* accumulator  */
    up=res+D2U(d)-1;               /* -> msu  */
    cut=d-(up-res)*DECDPUN;        /* digits in top unit  */
    for (c=cfirst;; c++) {         /* along the digits  */
      if (*c=='.') continue;       /* ignore '.' [don't decrement cut]  */
      out=X10(out)+(Int)*c-(Int)'0';
      if (c==last) break;          /* done [never get to trailing '.']  */
      cut--;
      if (cut>0) continue;         /* more for this unit  */
      *up=(Unit)out;               /* write unit  */
      up--;                        /* prepare for unit below..  */
      cut=DECDPUN;                 /* ..  */
      out=0;                       /* ..  */
      } /* c  */
    *up=(Unit)out;                 /* write lsu  */

    #else
    /* DECDPUN==1  */
    up=res;                        /* -> lsu  */
    for (c=last; c>=cfirst; c--) { /* over each character, from least  */
      if (*c=='.') continue;       /* ignore . [don't step up]  */
      *up=(Unit)((Int)*c-(Int)'0');
      up++;
      } /* c  */
    #endif

    dn->bits=bits;
    dn->exponent=exponent;
    dn->digits=d;

    /* if not in number (too long) shorten into the number  */
    if (d>set->digits) {
      residue=0;
      decSetCoeff(dn, set, res, d, &residue, &status);
      /* always check for overflow or subnormal and round as needed  */
      decFinalize(dn, set, &residue, &status);
      }
     else { /* no rounding, but may still have overflow or subnormal  */
      /* [these tests are just for performance; finalize repeats them]  */
      if ((dn->exponent-1<set->emin-dn->digits)
       || (dn->exponent-1>set->emax-set->digits)) {
        residue=0;
        decFinalize(dn, set, &residue, &status);
        }
      }
    /* decNumberShow(dn);  */
    } while(0);                         /* [for break]  */

  if (allocres!=NULL) free(allocres);   /* drop any storage used  */
  if (status!=0) decStatus(dn, status, set);
  return dn;
  }